

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

type_info * pybind11::detail::get_type_info(PyTypeObject *type)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  internals *piVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  type_info *in_RCX;
  ulong uVar6;
  __hash_code __code;
  __node_base_ptr p_Var7;
  bool bVar8;
  
  piVar3 = get_internals();
  uVar1 = (piVar3->registered_types_py)._M_h._M_bucket_count;
  do {
    uVar6 = (ulong)type % uVar1;
    p_Var2 = (piVar3->registered_types_py)._M_h._M_buckets[uVar6];
    p_Var4 = (__node_base_ptr)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var2, p_Var7 = p_Var2->_M_nxt, type != (PyTypeObject *)p_Var2->_M_nxt[1]._M_nxt))
    {
      while (p_Var5 = p_Var7->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var4 = (__node_base_ptr)0x0;
        if (((ulong)p_Var5[1]._M_nxt % uVar1 != uVar6) ||
           (p_Var4 = p_Var7, p_Var7 = p_Var5, type == (PyTypeObject *)p_Var5[1]._M_nxt))
        goto LAB_00115734;
      }
      p_Var4 = (__node_base_ptr)0x0;
    }
LAB_00115734:
    if (p_Var4 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var4->_M_nxt;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      type = type->tp_base;
      bVar8 = type != (PyTypeObject *)0x0;
      if (!bVar8) {
        in_RCX = (type_info *)0x0;
      }
    }
    else {
      in_RCX = (type_info *)p_Var5[2]._M_nxt;
      bVar8 = false;
    }
    if (!bVar8) {
      return in_RCX;
    }
  } while( true );
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info* get_type_info(PyTypeObject *type) {
    auto const &type_dict = get_internals().registered_types_py;
    do {
        auto it = type_dict.find(type);
        if (it != type_dict.end())
            return (detail::type_info *) it->second;
        type = type->tp_base;
        if (!type)
            return nullptr;
    } while (true);
}